

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflatePrime(z_streamp strm,int bits,int value)

{
  internal_state *piVar1;
  inflate_state *state;
  int value_local;
  int bits_local;
  z_streamp strm_local;
  int local_4;
  
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) {
    local_4 = -2;
  }
  else {
    piVar1 = strm->state;
    if ((bits < 0x11) && ((uint)(*(int *)&piVar1->window + bits) < 0x21)) {
      *(long *)&piVar1->w_bits =
           (long)(int)((value & (int)(1L << ((byte)bits & 0x3f)) - 1U) <<
                      ((byte)*(undefined4 *)&piVar1->window & 0x1f)) + *(long *)&piVar1->w_bits;
      *(int *)&piVar1->window = bits + *(int *)&piVar1->window;
      local_4 = 0;
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits > 16 || state->bits + bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += value << state->bits;
    state->bits += bits;
    return Z_OK;
}